

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O1

void __thiscall
basisu::vector<basisu::vector<unsigned_char>_>::~vector
          (vector<basisu::vector<unsigned_char>_> *this)

{
  uint uVar1;
  vector<unsigned_char> *pvVar2;
  void *__ptr;
  long lVar3;
  
  pvVar2 = this->m_p;
  if (pvVar2 != (vector<unsigned_char> *)0x0) {
    uVar1 = this->m_size;
    if ((ulong)uVar1 != 0) {
      lVar3 = 0;
      do {
        __ptr = *(void **)((long)&pvVar2->m_p + lVar3);
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        lVar3 = lVar3 + 0x10;
      } while ((ulong)uVar1 << 4 != lVar3);
    }
    free(this->m_p);
    return;
  }
  return;
}

Assistant:

inline ~vector()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
         }
      }